

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

Mapentry __thiscall sfc::Map::entry_at(Map *this,uint x,uint y)

{
  uint uVar1;
  Mapentry MVar2;
  size_type sVar3;
  const_reference pvVar4;
  int iVar5;
  int iVar6;
  uint tile_row;
  uint tile_col;
  uint y_local;
  uint x_local;
  Map *this_local;
  undefined4 uStack_10;
  Mapentry entry;
  
  tile_col = x;
  if (this->_map_width < x) {
    tile_col = this->_map_width;
  }
  tile_row = y;
  if (this->_map_height < y) {
    tile_row = this->_map_height;
  }
  uVar1 = this->_map_width;
  sVar3 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::size(&this->_entries);
  if (sVar3 < tile_row * uVar1 + tile_col) {
    Mapentry::Mapentry((Mapentry *)((long)&this_local + 4),0,0,false,false);
  }
  else {
    pvVar4 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::operator[]
                       (&this->_entries,(ulong)(tile_row * this->_map_width + tile_col));
    this_local._4_4_ = pvVar4->tile_index;
    uStack_10 = pvVar4->palette_index;
    entry.tile_index._0_1_ = pvVar4->flip_h;
    entry.tile_index._1_1_ = pvVar4->flip_v;
    entry.tile_index._2_2_ = *(undefined2 *)&pvVar4->field_0xa;
    if ((this->_tile_width != 8) || (this->_tile_height != 8)) {
      iVar5 = 2;
      if (this->_tile_width == 8) {
        iVar5 = 1;
      }
      iVar6 = 0x20;
      if (this->_tile_height == 8) {
        iVar6 = 0x10;
      }
      stack0xffffffffffffffec =
           CONCAT44(uStack_10,(this_local._4_4_ & 7) * iVar5 + ((uint)this_local._4_4_ >> 3) * iVar6
                   );
    }
  }
  MVar2.flip_h = (bool)(undefined1)entry.tile_index;
  MVar2.flip_v = (bool)entry.tile_index._1_1_;
  MVar2._10_2_ = entry.tile_index._2_2_;
  MVar2.tile_index = this_local._4_4_;
  MVar2.palette_index = uStack_10;
  return MVar2;
}

Assistant:

Mapentry Map::entry_at(unsigned x, unsigned y) const {
  if (x > _map_width)
    x = _map_width;
  if (y > _map_height)
    y = _map_height;
  if (((y * _map_width) + x) > _entries.size()) {
    return Mapentry();
  } else {
    Mapentry entry = _entries[(y * _map_width) + x];
    if (_tile_width == 8 && _tile_height == 8)
      return entry;

    // snes non-8x8 tilemap
    unsigned tile_col = entry.tile_index % 8;
    unsigned tile_row = entry.tile_index / 8;
    entry.tile_index = tile_col * (_tile_width == 8 ? 1 : 2) + tile_row * (_tile_height == 8 ? 16 : 32);
    return entry;
  }
}